

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

void __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
          (Frame<webfront::networking::TCPNetworkingTS> *this,
          span<const_std::byte,_18446744073709551615UL> dataHead,
          span<const_std::byte,_18446744073709551615UL> dataNext)

{
  bool bVar1;
  size_type size;
  Header *in_RDI;
  Header *in_stack_ffffffffffffff48;
  unsigned_long *in_stack_ffffffffffffff50;
  span<const_std::byte,_18446744073709551615UL> *this_00;
  Header *in_stack_ffffffffffffff58;
  byte *__args;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *in_stack_ffffffffffffff60;
  span<const_std::byte,_18446744073709551615UL> *this_01;
  span<const_std::byte,_18446744073709551615UL> local_20;
  span<const_std::byte,_18446744073709551615UL> local_10;
  
  Header::Header((Header *)0x13f351);
  http::std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::vector((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
            *)0x13f36c);
  Header::setFIN(in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
  Header::setOpcode(in_stack_ffffffffffffff58,(Opcode)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  size = http::std::span<const_std::byte,_18446744073709551615UL>::size
                   ((span<const_std::byte,_18446744073709551615UL> *)0x13f397);
  http::std::span<const_std::byte,_18446744073709551615UL>::size
            ((span<const_std::byte,_18446744073709551615UL> *)0x13f3a9);
  Header::setPayloadSize(in_RDI,size);
  http::std::array<std::byte,_14UL>::data((array<std::byte,_14UL> *)0x13f3c5);
  Header::headerSize(in_stack_ffffffffffffff48);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte*,unsigned_long>
            (in_stack_ffffffffffffff60,(byte **)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  this_01 = &local_10;
  http::std::span<const_std::byte,_18446744073709551615UL>::data(this_01);
  http::std::span<const_std::byte,_18446744073709551615UL>::size
            ((span<const_std::byte,_18446744073709551615UL> *)0x13f436);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
              *)this_01,(byte **)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = http::std::span<const_std::byte,_18446744073709551615UL>::empty
                    ((span<const_std::byte,_18446744073709551615UL> *)0x13f45e);
  if (!bVar1) {
    __args = in_RDI[1].raw._M_elems + 2;
    this_00 = &local_20;
    http::std::span<const_std::byte,_18446744073709551615UL>::data(this_00);
    http::std::span<const_std::byte,_18446744073709551615UL>::size
              ((span<const_std::byte,_18446744073709551615UL> *)0x13f491);
    std::
    vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
    ::emplace_back<std::byte_const*,unsigned_long>
              ((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                *)this_01,(byte **)__args,(unsigned_long *)this_00);
  }
  return;
}

Assistant:

Frame(std::span<const std::byte> dataHead, std::span<const std::byte> dataNext = {}) {
        setFIN(true);
        setOpcode(Opcode::binary);
        setPayloadSize(dataHead.size() + dataNext.size());
        buffers.emplace_back(raw.data(), headerSize());
        buffers.emplace_back(dataHead.data(), dataHead.size());
        if (!dataNext.empty()) buffers.emplace_back(dataNext.data(), dataNext.size());
    }